

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<unsigned_long_long,long_long,double>
               (ImGuiDataType data_type,unsigned_long_long *v,float v_speed,unsigned_long_long v_min
               ,unsigned_long_long v_max,char *format,float power,ImGuiDragFlags flags)

{
  bool bVar1;
  double dVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  uint uVar6;
  ImGuiInputSource IVar7;
  int decimal_precision;
  float *pfVar8;
  ulong uVar9;
  long lVar10;
  unsigned_long_long uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  undefined4 uVar21;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar22;
  float fVar23;
  double local_88;
  ImVec2 local_38;
  
  pIVar4 = GImGui;
  uVar6 = data_type & 0xfffffffe;
  bVar14 = uVar6 != 8;
  bVar15 = v_max - v_min != 0;
  bVar1 = power == 1.0;
  if (v_speed == 0.0 && bVar15) {
    v_speed = (float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  uVar12 = flags & 1;
  IVar7 = GImGui->ActiveIdSource;
  if (IVar7 == ImGuiInputSource_Mouse) {
    bVar5 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar5) || ((pIVar4->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      IVar7 = pIVar4->ActiveIdSource;
      goto LAB_0013f4cb;
    }
    pfVar8 = ImVec2::operator[](&(pIVar4->IO).MouseDelta,(ulong)uVar12);
    fVar23 = *pfVar8;
    if ((pIVar4->IO).KeyAlt != false) {
      fVar23 = fVar23 * 0.01;
    }
    if ((pIVar4->IO).KeyShift == true) {
      fVar23 = fVar23 * 10.0;
    }
  }
  else {
LAB_0013f4cb:
    fVar23 = 0.0;
    if (IVar7 == ImGuiInputSource_Nav) {
      decimal_precision = 0;
      if (uVar6 == 8) {
        decimal_precision = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      pfVar8 = ImVec2::operator[](&local_38,(ulong)uVar12);
      fVar23 = *pfVar8;
      fVar22 = GetMinimumStepAtDecimalPrecision(decimal_precision);
      v_speed = (float)((uint)v_speed & -(uint)(fVar22 <= v_speed) |
                       ~-(uint)(fVar22 <= v_speed) & (uint)fVar22);
    }
  }
  fVar23 = fVar23 * v_speed;
  fVar22 = fVar23;
  if (uVar12 != 0) {
    fVar22 = -fVar23;
  }
  uVar13 = v_max - v_min;
  if (uVar13 == 0) {
    bVar5 = false;
  }
  else if ((*v < v_max) || (bVar5 = true, fVar22 <= 0.0)) {
    bVar5 = fVar22 < 0.0 && *v <= v_min;
  }
  if ((bVar14 || !bVar15) || bVar1) {
LAB_0013f5e5:
    bVar3 = false;
  }
  else {
    if ((fVar22 < 0.0) && (0.0 < pIVar4->DragCurrentAccum)) goto LAB_0013f619;
    if (fVar22 <= 0.0) goto LAB_0013f5e5;
    bVar3 = pIVar4->DragCurrentAccum <= 0.0 && pIVar4->DragCurrentAccum != 0.0;
  }
  if (((pIVar4->ActiveIdIsJustActivated & 1U) == 0 && !bVar5) && (!bVar3)) {
    if ((fVar23 != 0.0) || (NAN(fVar23))) {
      pIVar4->DragCurrentAccum = pIVar4->DragCurrentAccum + fVar22;
      pIVar4->DragCurrentAccumDirty = true;
    }
    else if ((pIVar4->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    uVar21 = (undefined4)(uVar13 >> 0x20);
    if ((bVar14 || !bVar15) || bVar1) {
      uVar9 = (ulong)pIVar4->DragCurrentAccum;
      uVar11 = *v + ((long)(pIVar4->DragCurrentAccum - 9.223372e+18) & (long)uVar9 >> 0x3f | uVar9);
      local_88 = 0.0;
    }
    else {
      lVar10 = *v - v_min;
      auVar17._8_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar17._0_8_ = lVar10;
      auVar17._12_4_ = 0x45300000;
      auVar18._8_4_ = uVar21;
      auVar18._0_8_ = uVar13;
      auVar18._12_4_ = 0x45300000;
      local_88 = pow(((auVar17._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) /
                     ((auVar18._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0)),
                     1.0 / (double)power);
      fVar16 = (float)((double)(pIVar4->DragCurrentAccum / (float)uVar13) + local_88);
      fVar23 = 1.0;
      if (fVar16 <= 1.0) {
        fVar23 = fVar16;
      }
      fVar23 = powf((float)(~-(uint)(fVar16 < 0.0) & (uint)fVar23),power);
      uVar11 = ((long)(fVar23 - 9.223372e+18) & (long)fVar23 >> 0x3f | (long)fVar23) * uVar13 +
               v_min;
    }
    uVar11 = RoundScalarWithFormatT<unsigned_long_long,long_long>(format,data_type,uVar11);
    pIVar4->DragCurrentAccumDirty = false;
    if ((bVar14 || !bVar15) || bVar1) {
      uVar13 = *v;
      pIVar4->DragCurrentAccum = pIVar4->DragCurrentAccum - (float)(long)(uVar11 - uVar13);
    }
    else {
      lVar10 = uVar11 - v_min;
      auVar19._8_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar19._0_8_ = lVar10;
      auVar19._12_4_ = 0x45300000;
      auVar20._8_4_ = uVar21;
      auVar20._0_8_ = uVar13;
      auVar20._12_4_ = 0x45300000;
      dVar2 = pow(((auVar19._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) /
                  ((auVar20._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0)),
                  1.0 / (double)power);
      pIVar4->DragCurrentAccum = pIVar4->DragCurrentAccum - (float)(dVar2 - local_88);
      uVar13 = *v;
    }
    if ((v_max != v_min) && (uVar13 != uVar11)) {
      if ((uVar11 < v_min) || (((uVar6 != 8 && (uVar13 < uVar11)) && (fVar22 < 0.0)))) {
        uVar11 = v_min;
      }
      if ((v_max < uVar11) || (((uVar6 != 8 && (uVar11 < uVar13)) && (0.0 < fVar22)))) {
        uVar11 = v_max;
      }
    }
    if (uVar13 == uVar11) {
      return false;
    }
    *v = uVar11;
    return true;
  }
LAB_0013f619:
  pIVar4->DragCurrentAccum = 0.0;
  pIVar4->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool has_min_max = (v_min != v_max);
    const bool is_power = (power != 1.0f && is_decimal && has_min_max && (v_max - v_min < FLT_MAX));

    // Default tweak speed
    if (v_speed == 0.0f && has_min_max && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = has_min_max && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (TYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (TYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && has_min_max)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}